

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack31_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  *out = (*in & 0x7fffffff) + base;
  uVar1 = *in;
  out[1] = -((int)uVar1 >> 0x1f);
  out[1] = -((int)uVar1 >> 0x1f) + base + (in[1] & 0x3fffffff) * 2;
  uVar2 = in[1];
  out[2] = uVar2 >> 0x1e;
  out[2] = (uVar2 >> 0x1e) + base + (in[2] & 0x1fffffff) * 4;
  uVar2 = in[2];
  out[3] = uVar2 >> 0x1d;
  out[3] = (uVar2 >> 0x1d) + base + (in[3] & 0xfffffff) * 8;
  uVar2 = in[3];
  out[4] = uVar2 >> 0x1c;
  out[4] = (uVar2 >> 0x1c) + base + (in[4] & 0x7ffffff) * 0x10;
  uVar2 = in[4];
  out[5] = uVar2 >> 0x1b;
  out[5] = (uVar2 >> 0x1b) + base + (in[5] & 0x3ffffff) * 0x20;
  uVar2 = in[5];
  out[6] = uVar2 >> 0x1a;
  out[6] = (uVar2 >> 0x1a) + base + (in[6] & 0x1ffffff) * 0x40;
  uVar2 = in[6];
  out[7] = uVar2 >> 0x19;
  out[7] = (uVar2 >> 0x19) + base + (in[7] & 0xffffff) * 0x80;
  uVar2 = in[7];
  out[8] = uVar2 >> 0x18;
  out[8] = (uVar2 >> 0x18) + base + (in[8] & 0x7fffff) * 0x100;
  uVar2 = in[8];
  out[9] = uVar2 >> 0x17;
  out[9] = (uVar2 >> 0x17) + base + (in[9] & 0x3fffff) * 0x200;
  uVar2 = in[9];
  out[10] = uVar2 >> 0x16;
  out[10] = (uVar2 >> 0x16) + base + (in[10] & 0x1fffff) * 0x400;
  uVar2 = in[10];
  out[0xb] = uVar2 >> 0x15;
  out[0xb] = (uVar2 >> 0x15) + base + (in[0xb] & 0xfffff) * 0x800;
  uVar2 = in[0xb];
  out[0xc] = uVar2 >> 0x14;
  out[0xc] = (uVar2 >> 0x14) + base + (in[0xc] & 0x7ffff) * 0x1000;
  uVar2 = in[0xc];
  out[0xd] = uVar2 >> 0x13;
  out[0xd] = (uVar2 >> 0x13) + base + (in[0xd] & 0x3ffff) * 0x2000;
  uVar2 = in[0xd];
  out[0xe] = uVar2 >> 0x12;
  out[0xe] = (uVar2 >> 0x12) + base + (in[0xe] & 0x1ffff) * 0x4000;
  uVar2 = in[0xe];
  out[0xf] = uVar2 >> 0x11;
  out[0xf] = (uVar2 >> 0x11) + base + (in[0xf] & 0xffff) * 0x8000;
  return in + 0x10;
}

Assistant:

uint32_t * unpack31_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 31 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 30 ))<<( 31 - 30 );
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 29 ))<<( 31 - 29 );
    *out += base;
    out++;
    *out = ( (*in) >>  29  ) ;
    ++in;
    *out |= ((*in) % (1U<< 28 ))<<( 31 - 28 );
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 27 ))<<( 31 - 27 );
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 26 ))<<( 31 - 26 );
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 25 ))<<( 31 - 25 );
    *out += base;
    out++;
    *out = ( (*in) >>  25  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 31 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 23 ))<<( 31 - 23 );
    *out += base;
    out++;
    *out = ( (*in) >>  23  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 31 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 21 ))<<( 31 - 21 );
    *out += base;
    out++;
    *out = ( (*in) >>  21  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 31 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 19 ))<<( 31 - 19 );
    *out += base;
    out++;
    *out = ( (*in) >>  19  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 31 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 17 ))<<( 31 - 17 );
    *out += base;
    out++;
    *out = ( (*in) >>  17  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 31 - 16 );
    *out += base;
    out++;

    return in + 1;
}